

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O3

Vec_Vec_t * Aig_ManLevelize(Aig_Man_t *p)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  long lVar4;
  Vec_Vec_t *pVVar5;
  void **ppvVar6;
  void *pvVar7;
  void *pvVar8;
  Vec_Ptr_t *pVVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong local_40;
  
  lVar4 = (long)p->vCos->nSize;
  if (lVar4 < 1) {
    uVar14 = 0;
  }
  else {
    lVar11 = 0;
    uVar14 = 0;
    do {
      uVar13 = *(uint *)((*(ulong *)((long)p->vCos->pArray[lVar11] + 8) & 0xfffffffffffffffe) + 0x1c
                        ) & 0xffffff;
      if (uVar14 <= uVar13) {
        uVar14 = uVar13;
      }
      lVar11 = lVar11 + 1;
    } while (lVar4 != lVar11);
  }
  uVar13 = uVar14 + 1;
  pVVar5 = (Vec_Vec_t *)malloc(0x10);
  local_40 = 8;
  if (8 < uVar13) {
    local_40 = (ulong)uVar13;
  }
  pVVar5->nCap = (int)local_40;
  ppvVar6 = (void **)malloc(local_40 * 8);
  pVVar5->pArray = ppvVar6;
  uVar12 = 0;
  do {
    pvVar7 = calloc(1,0x10);
    ppvVar6[uVar12] = pvVar7;
    uVar12 = uVar12 + 1;
  } while (uVar13 != uVar12);
  pVVar5->nSize = uVar13;
  pVVar9 = p->vObjs;
  if (0 < pVVar9->nSize) {
    lVar4 = 0;
    uVar12 = (ulong)uVar13;
    do {
      pvVar7 = pVVar9->pArray[lVar4];
      uVar10 = uVar12;
      if (pvVar7 != (void *)0x0) {
        uVar16 = (uint)((ulong)*(undefined8 *)((long)pvVar7 + 0x18) >> 0x20);
        uVar13 = uVar16 & 0xffffff;
        if (uVar14 < uVar13) {
          __assert_fail("(int)pObj->Level <= nLevels",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                        ,0x13c,"Vec_Vec_t *Aig_ManLevelize(Aig_Man_t *)");
        }
        uVar15 = (uint)uVar12;
        if (uVar13 < uVar15) {
          if (uVar15 <= uVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                          ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
          }
        }
        else {
          uVar1 = uVar13 + 1;
          uVar10 = (ulong)uVar1;
          ppvVar6 = pVVar5->pArray;
          bVar3 = (uint)local_40 <= uVar13;
          if (bVar3) {
            if (ppvVar6 == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)(uVar1 * 8));
            }
            else {
              ppvVar6 = (void **)realloc(ppvVar6,(ulong)(uVar1 * 8));
            }
            pVVar5->pArray = ppvVar6;
            pVVar5->nCap = uVar1;
            local_40 = uVar10;
          }
          lVar11 = 0;
          do {
            pvVar8 = calloc(1,0x10);
            ppvVar6[uVar12 + lVar11] = pvVar8;
            lVar11 = lVar11 + 1;
          } while ((uVar13 - uVar15) + 1 != (int)lVar11);
          pVVar5->nSize = uVar1;
        }
        puVar2 = (uint *)pVVar5->pArray[uVar16 & 0xffffff];
        uVar13 = puVar2[1];
        if (uVar13 == *puVar2) {
          if ((int)uVar13 < 0x10) {
            if (*(void **)(puVar2 + 2) == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(*(void **)(puVar2 + 2),0x80);
            }
            *(void **)(puVar2 + 2) = pvVar8;
            *puVar2 = 0x10;
          }
          else {
            if (*(void **)(puVar2 + 2) == (void *)0x0) {
              pvVar8 = malloc((ulong)uVar13 << 4);
            }
            else {
              pvVar8 = realloc(*(void **)(puVar2 + 2),(ulong)uVar13 << 4);
            }
            *(void **)(puVar2 + 2) = pvVar8;
            *puVar2 = uVar13 * 2;
          }
        }
        else {
          pvVar8 = *(void **)(puVar2 + 2);
        }
        uVar13 = puVar2[1];
        puVar2[1] = uVar13 + 1;
        *(void **)((long)pvVar8 + (long)(int)uVar13 * 8) = pvVar7;
        pVVar9 = p->vObjs;
      }
      lVar4 = lVar4 + 1;
      uVar12 = uVar10;
    } while (lVar4 < pVVar9->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Vec_t * Aig_ManLevelize( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, i;
    nLevels = Aig_ManLevelNum( p );
    vLevels = Vec_VecStart( nLevels + 1 );
    Aig_ManForEachObj( p, pObj, i )
    {
        assert( (int)pObj->Level <= nLevels );
        Vec_VecPush( vLevels, pObj->Level, pObj );
    }
    return vLevels;
}